

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O1

void duckdb::QuantileOperation::Destroy<duckdb::QuantileState<long,duckdb::QuantileStandardType>>
               (QuantileState<long,_duckdb::QuantileStandardType> *state,AggregateInputData *param_2
               )

{
  _Head_base<0UL,_duckdb::QuantileCursor<long>_*,_false> __ptr;
  _Head_base<0UL,_duckdb::WindowQuantileState<long>_*,_false> __ptr_00;
  pointer plVar1;
  
  __ptr._M_head_impl =
       (state->window_cursor).
       super_unique_ptr<duckdb::QuantileCursor<long>,_std::default_delete<duckdb::QuantileCursor<long>_>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::QuantileCursor<long>,_std::default_delete<duckdb::QuantileCursor<long>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::QuantileCursor<long>_*,_std::default_delete<duckdb::QuantileCursor<long>_>_>
       .super__Head_base<0UL,_duckdb::QuantileCursor<long>_*,_false>._M_head_impl;
  if (__ptr._M_head_impl != (QuantileCursor<long> *)0x0) {
    std::default_delete<duckdb::QuantileCursor<long>_>::operator()
              ((default_delete<duckdb::QuantileCursor<long>_> *)&state->window_cursor,
               __ptr._M_head_impl);
  }
  (state->window_cursor).
  super_unique_ptr<duckdb::QuantileCursor<long>,_std::default_delete<duckdb::QuantileCursor<long>_>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::QuantileCursor<long>,_std::default_delete<duckdb::QuantileCursor<long>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::QuantileCursor<long>_*,_std::default_delete<duckdb::QuantileCursor<long>_>_>
  .super__Head_base<0UL,_duckdb::QuantileCursor<long>_*,_false>._M_head_impl =
       (QuantileCursor<long> *)0x0;
  __ptr_00._M_head_impl =
       (state->window_state).
       super_unique_ptr<duckdb::WindowQuantileState<long>,_std::default_delete<duckdb::WindowQuantileState<long>_>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::WindowQuantileState<long>,_std::default_delete<duckdb::WindowQuantileState<long>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::WindowQuantileState<long>_*,_std::default_delete<duckdb::WindowQuantileState<long>_>_>
       .super__Head_base<0UL,_duckdb::WindowQuantileState<long>_*,_false>._M_head_impl;
  if (__ptr_00._M_head_impl != (WindowQuantileState<long> *)0x0) {
    std::default_delete<duckdb::WindowQuantileState<long>_>::operator()
              ((default_delete<duckdb::WindowQuantileState<long>_> *)&state->window_state,
               __ptr_00._M_head_impl);
  }
  (state->window_state).
  super_unique_ptr<duckdb::WindowQuantileState<long>,_std::default_delete<duckdb::WindowQuantileState<long>_>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::WindowQuantileState<long>,_std::default_delete<duckdb::WindowQuantileState<long>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowQuantileState<long>_*,_std::default_delete<duckdb::WindowQuantileState<long>_>_>
  .super__Head_base<0UL,_duckdb::WindowQuantileState<long>_*,_false>._M_head_impl =
       (WindowQuantileState<long> *)0x0;
  plVar1 = (state->v).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  if (plVar1 != (pointer)0x0) {
    operator_delete(plVar1);
    return;
  }
  return;
}

Assistant:

static void Destroy(STATE &state, AggregateInputData &) {
		state.~STATE();
	}